

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathBezierCubicCurveTo
          (ImDrawList *this,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,int num_segments)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  int iVar3;
  ImVec2 *__src;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  long lVar14;
  ImVec2 *__dest;
  int iVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  lVar14 = (long)(this->_Path).Size;
  if (lVar14 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                  ,0x674,"T &ImVector<ImVec2>::back() [T = ImVec2]");
  }
  IVar1 = (this->_Path).Data[lVar14 + -1];
  auVar20._8_8_ = 0;
  auVar20._0_4_ = IVar1.x;
  auVar20._4_4_ = IVar1.y;
  if (num_segments == 0) {
    auVar20 = vmovshdup_avx(auVar20);
    PathBezierCubicCurveToCasteljau
              (&this->_Path,IVar1.x,auVar20._0_4_,p2->x,p2->y,p3->x,p3->y,p4->x,p4->y,
               this->_Data->CurveTessellationTol,0);
  }
  else if (0 < num_segments) {
    iVar16 = 1;
    do {
      fVar4 = (1.0 / (float)num_segments) * (float)iVar16;
      fVar7 = 1.0 - fVar4;
      fVar12 = p2->x;
      fVar13 = p2->y;
      fVar10 = p3->x;
      fVar11 = p3->y;
      fVar8 = p4->x;
      fVar9 = p4->y;
      iVar17 = (this->_Path).Size;
      iVar3 = (this->_Path).Capacity;
      if (iVar17 == iVar3) {
        if (iVar3 == 0) {
          iVar15 = 8;
        }
        else {
          iVar15 = iVar3 / 2 + iVar3;
        }
        iVar17 = iVar17 + 1;
        if (iVar17 < iVar15) {
          iVar17 = iVar15;
        }
        if (iVar3 < iVar17) {
          __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar17 << 3);
          __src = (this->_Path).Data;
          if (__src != (ImVec2 *)0x0) {
            memcpy(__dest,__src,(long)(this->_Path).Size << 3);
            ImGui::MemFree((this->_Path).Data);
          }
          (this->_Path).Data = __dest;
          (this->_Path).Capacity = iVar17;
        }
      }
      fVar5 = fVar7 * fVar7 * fVar7;
      fVar6 = fVar4 * fVar7 * fVar7 * 3.0;
      fVar7 = fVar4 * fVar4 * fVar7 * 3.0;
      fVar4 = fVar4 * fVar4 * fVar4;
      auVar19._0_4_ = fVar4 * fVar8 + fVar10 * fVar7 + IVar1.x * fVar5 + fVar12 * fVar6;
      auVar19._4_4_ = fVar4 * fVar9 + fVar11 * fVar7 + IVar1.y * fVar5 + fVar13 * fVar6;
      auVar19._8_4_ = fVar4 * 0.0 + fVar7 * 0.0 + fVar5 * 0.0 + fVar6 * 0.0;
      auVar19._12_4_ = fVar4 * 0.0 + fVar7 * 0.0 + fVar5 * 0.0 + fVar6 * 0.0;
      IVar2 = (ImVec2)vmovlps_avx(auVar19);
      (this->_Path).Data[(this->_Path).Size] = IVar2;
      (this->_Path).Size = (this->_Path).Size + 1;
      bVar18 = iVar16 != num_segments;
      iVar16 = iVar16 + 1;
    } while (bVar18);
  }
  return;
}

Assistant:

void ImDrawList::PathBezierCubicCurveTo(const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        PathBezierCubicCurveToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, p4.x, p4.y, _Data->CurveTessellationTol, 0); // Auto-tessellated
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
            _Path.push_back(ImBezierCubicCalc(p1, p2, p3, p4, t_step * i_step));
    }
}